

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
dynet::PickRange::autobatch_concat
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,PickRange *this,
          ComputationGraph *cg)

{
  allocator_type local_d;
  value_type_conflict2 local_c;
  
  local_c = 1;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,1,&local_c,&local_d);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<int> autobatch_concat(const ComputationGraph & cg) const override { return std::vector<int>(1, 1); }